

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O3

void __thiscall
density::detail::
LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::~LFQueue_Tail(LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                *this)

{
  void *i_page;
  pointer ppIVar1;
  
  i_page = (void *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
  if (i_page != (void *)0xc0) {
    density_tests::DeepTestAllocator<256UL>::deallocate_page
              ((DeepTestAllocator<256UL> *)this,i_page);
  }
  ppIVar1 = (this->
            super_LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
            ).super_DeepTestAllocator<256UL>.m_hooks.
            super__Vector_base<density_tests::IAllocatorHook_*,_std::allocator<density_tests::IAllocatorHook_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar1 != (pointer)0x0) {
    operator_delete(ppIVar1);
  }
  density_tests::SharedBlockRegistry::~SharedBlockRegistry((SharedBlockRegistry *)this);
  return;
}

Assistant:

~LFQueue_Tail()
            {
                auto const tail = m_tail.load();
                DENSITY_ASSUME_UINT_ALIGNED(tail, s_alloc_granularity); // put in progress?
                if (tail != s_invalid_control_block)
                {
                    ALLOCATOR_TYPE::deallocate_page(reinterpret_cast<void *>(tail));
                }
            }